

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O2

int uni_thread_new(char *name,_func_void_ptr_void_ptr *fn,void *arg,int stack_size)

{
  int iVar1;
  pthread_t pid;
  pthread_attr_t attr;
  
  pthread_attr_init((pthread_attr_t *)&attr);
  pthread_attr_setstacksize((pthread_attr_t *)&attr,(long)stack_size);
  iVar1 = pthread_create(&pid,(pthread_attr_t *)&attr,(__start_routine *)fn,arg);
  if (iVar1 == 0) {
    pthread_detach(pid);
    iVar1 = 0;
  }
  else {
    iVar1 = -3;
  }
  pthread_attr_destroy((pthread_attr_t *)&attr);
  return iVar1;
}

Assistant:

int uni_thread_new(const char *name, void* (*fn)(void *), void *arg, int stack_size) {
    pthread_t pid;
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    pthread_attr_setstacksize(&attr, stack_size);
    if (0 != pthread_create(&pid, &attr, fn, arg)) {
        pthread_attr_destroy(&attr);
        return -CREATE_TASK_FAIL;
    }

    pthread_detach(pid);
    pthread_attr_destroy(&attr);
    return OK;
}